

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O0

bool __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Converter::ConvertToStore
          (Converter *this,char *a_pszString)

{
  size_t sVar1;
  ulong uVar2;
  char *a_pOutputData;
  size_t uLen;
  char *a_pszString_local;
  Converter *this_local;
  
  sVar1 = SI_ConvertA<char>::SizeToStore(&this->super_SI_ConvertA<char>,a_pszString);
  if (sVar1 == 0xffffffffffffffff) {
    this_local._7_1_ = false;
  }
  else {
    while (uVar2 = std::__cxx11::string::size(), uVar2 < sVar1) {
      std::__cxx11::string::size();
      std::__cxx11::string::resize((ulong)&this->m_scratch);
    }
    a_pOutputData = (char *)std::__cxx11::string::data();
    sVar1 = std::__cxx11::string::size();
    this_local._7_1_ =
         SI_ConvertA<char>::ConvertToStore
                   (&this->super_SI_ConvertA<char>,a_pszString,a_pOutputData,sVar1);
  }
  return this_local._7_1_;
}

Assistant:

bool ConvertToStore(const SI_CHAR * a_pszString) {
            size_t uLen = SizeToStore(a_pszString);
            if (uLen == (size_t)(-1)) {
                return false;
            }
            while (uLen > m_scratch.size()) {
                m_scratch.resize(m_scratch.size() * 2);
            }
            return SI_CONVERTER::ConvertToStore(
                a_pszString,
                const_cast<char*>(m_scratch.data()),
                m_scratch.size());
        }